

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall DivideTest<long>::run(DivideTest<long> *this)

{
  DivideTest<long> *in_RDI;
  int i_1;
  long denom_1;
  int j;
  int i;
  UT denom;
  set_t<long> tested_denom;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar1;
  DivideTest<long> *in_stack_ffffffffffffffa0;
  int local_54;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffb4;
  long in_stack_ffffffffffffffb8;
  DivideTest<long> *this_00;
  
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x11fa4d);
  for (this_00 = (DivideTest<long> *)0x1; this_00 < (DivideTest<long> *)0x400;
      this_00 = (DivideTest<long> *)((long)&this_00->seed + 1)) {
    test_both_signs(in_stack_ffffffffffffffa0,
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (set_t<long> *)in_RDI);
  }
  std::numeric_limits<long>::min();
  test_all_algorithms(this_00,in_stack_ffffffffffffffb8,
                      (set_t<long> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  std::numeric_limits<long>::max();
  test_all_algorithms(this_00,in_stack_ffffffffffffffb8,
                      (set_t<long> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (iVar2 = 1; iVar2 < 0x3f; iVar2 = iVar2 + 1) {
    for (local_54 = -1; local_54 < 2; local_54 = local_54 + 1) {
      test_both_signs((DivideTest<long> *)((1L << ((ulong)(byte)iVar2 & 0x3f)) + (long)local_54),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (set_t<long> *)in_RDI);
    }
  }
  for (iVar1 = 0; iVar1 < 10000; iVar1 = iVar1 + 1) {
    random_denominator(in_RDI);
    test_all_algorithms(this_00,in_stack_ffffffffffffffb8,
                        (set_t<long> *)CONCAT44(in_stack_ffffffffffffffb4,iVar2));
  }
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x11fb97);
  return;
}

Assistant:

void run() {
        set_t<T> tested_denom;

        // Test small values
#if defined(__AVR__)
        UT primes[] = {2, 3, 5, 7, 11, 13, 17, 19, 23, 29, 31, 37, 41, 43, 47, 53, 59, 61, 67, 71,
            73, 79, 83, 89, 97, 101, 103, 107, 109, 113, 127, 131, 137, 139, 149, 151, 157, 163,
            167, 173};
        for (size_t index = 0; index < sizeof(primes) / sizeof(primes[0]); ++index) {
            test_both_signs(primes[index], tested_denom);
        }
#else
        for (UT denom = 1; denom < 1024; ++denom) {
            test_both_signs(denom, tested_denom);
        }
#endif

        if (limits::is_signed) {
            PRINT_PROGRESS_MSG(F("Testing minimum\n"));
            test_all_algorithms((limits::min)(), tested_denom);
        }

        PRINT_PROGRESS_MSG(F("Testing maximum\n"));
        test_all_algorithms((limits::max)(), tested_denom);

        // test power of 2 denoms: 2^i-1, 2^i, 2^i+1
        PRINT_PROGRESS_MSG(F("Testing powers of 2\n"));
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T denom = static_cast<UT>((static_cast<T>(1) << i) + j);

                test_both_signs(denom, tested_denom);
            }
        }

        // test all bits set:
        // 11111111, 11111110, 11111100, ...
        PRINT_PROGRESS_MSG(F("Testing all bits set\n"));
        // For signed types, this degenerates to negative powers of
        // 2 (-1, -2, -4....): since we just tested those (above), skip.
        if (!limits::is_signed) {
            for (UT bits = (std::numeric_limits<UT>::max)(); bits != 0; bits <<= 1) {
                PRINT_PROGRESS_MSG((T)bits);
                PRINT_PROGRESS_MSG("\n");
                test_all_algorithms((T)bits, tested_denom);
            }
        }

        // Test random denominators
#if !defined(__AVR__)
        PRINT_PROGRESS_MSG(F("Test random denominators\n"));
        for (int i = 0; i < 10000; ++i) {
            test_all_algorithms(random_denominator(), tested_denom);
        }
#endif
    }